

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_chatclient.cpp
# Opt level: O0

void ChatClient::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  QMetaType QVar3;
  int *result;
  QMetaType local_38;
  QMetaType local_30;
  QObject *local_28;
  ChatClient *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (ChatClient *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      connected((ChatClient *)_o);
      break;
    case 1:
      loggedIn((ChatClient *)_o);
      break;
    case 2:
      loginError((ChatClient *)_o,(QString *)_a[1]);
      break;
    case 3:
      disconnected((ChatClient *)_o);
      break;
    case 4:
      messageReceived((ChatClient *)_o,(QString *)_a[1],(QString *)_a[2]);
      break;
    case 5:
      error((ChatClient *)_o,*_a[1]);
      break;
    case 6:
      userJoined((ChatClient *)_o,(QString *)_a[1]);
      break;
    case 7:
      userLeft((ChatClient *)_o,(QString *)_a[1]);
      break;
    case 8:
      connectToServer((ChatClient *)_o,(QHostAddress *)_a[1],*_a[2]);
      break;
    case 9:
      login((ChatClient *)_o,(QString *)_a[1]);
      break;
    case 10:
      sendMessage((ChatClient *)_o,(QString *)_a[1]);
      break;
    case 0xb:
      disconnectFromHost((ChatClient *)_o);
      break;
    case 0xc:
      onReadyRead((ChatClient *)_o);
    }
  }
  else if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 5) {
      if (*_a[1] == 0) {
        QVar3 = QMetaType::fromType<QAbstractSocket::SocketError>();
        **(undefined8 **)_t = QVar3.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)_t = local_38.d_ptr;
      }
    }
    else {
      memset(&local_30,0,8);
      QMetaType::QMetaType(&local_30);
      **(undefined8 **)_t = local_30.d_ptr;
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == connected && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == loggedIn && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == loginError && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
        else {
          pcVar2 = *_a[1];
          if (pcVar2 == disconnected && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0))
          {
            *puVar1 = 3;
          }
          else {
            pcVar2 = *_a[1];
            if (pcVar2 == messageReceived &&
                (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
              *puVar1 = 4;
            }
            else {
              pcVar2 = *_a[1];
              if (pcVar2 == error && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
                *puVar1 = 5;
              }
              else {
                pcVar2 = *_a[1];
                if (pcVar2 == userJoined &&
                    (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
                  *puVar1 = 6;
                }
                else {
                  pcVar2 = *_a[1];
                  if (pcVar2 == userLeft &&
                      (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
                    *puVar1 = 7;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ChatClient::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ChatClient *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->connected(); break;
        case 1: _t->loggedIn(); break;
        case 2: _t->loginError((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->disconnected(); break;
        case 4: _t->messageReceived((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 5: _t->error((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 6: _t->userJoined((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->userLeft((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->connectToServer((*reinterpret_cast< std::add_pointer_t<QHostAddress>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<quint16>>(_a[2]))); break;
        case 9: _t->login((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 10: _t->sendMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 11: _t->disconnectFromHost(); break;
        case 12: _t->onReadyRead(); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ChatClient::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::connected)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::loggedIn)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::loginError)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::disconnected)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(const QString & , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::messageReceived)) {
                *result = 4;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(QAbstractSocket::SocketError );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::error)) {
                *result = 5;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::userJoined)) {
                *result = 6;
                return;
            }
        }
        {
            using _t = void (ChatClient::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ChatClient::userLeft)) {
                *result = 7;
                return;
            }
        }
    }
}